

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O3

int Gia_ManResubVerify(Gia_ResbMan_t *p,word *pFunc)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  word *pwVar4;
  int iVar5;
  word *pwVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  Vec_Wrd_t *pVVar10;
  ulong uVar11;
  word *pwVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  
  uVar16 = p->vGates->nSize;
  if ((ulong)uVar16 == 0) {
    return -1;
  }
  if ((int)uVar16 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  uVar1 = p->vGates->pArray[(ulong)uVar16 - 1];
  if ((int)uVar1 < 0) {
    __assert_fail("iTopLit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                  ,0x1cf,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
  }
  if (uVar1 == 1) {
    uVar16 = p->nWords;
    if (pFunc == (word *)0x0) {
      if ((int)uVar16 < 1) {
        return 1;
      }
    }
    else {
      if ((int)uVar16 < 1) {
        return 1;
      }
      memset(pFunc,0xff,(ulong)uVar16 * 8);
    }
    uVar8 = 0;
    do {
      if (p->pSets[0][uVar8] != 0) {
        return 0;
      }
      uVar8 = uVar8 + 1;
    } while (uVar16 != uVar8);
  }
  else if (uVar1 == 0) {
    uVar16 = p->nWords;
    if (pFunc == (word *)0x0) {
      if ((int)uVar16 < 1) {
        return 1;
      }
    }
    else {
      if ((int)uVar16 < 1) {
        return 1;
      }
      memset(pFunc,0,(ulong)uVar16 * 8);
    }
    uVar8 = 0;
    do {
      if (p->pSets[1][uVar8] != 0) {
        return 0;
      }
      uVar8 = uVar8 + 1;
    } while (uVar16 != uVar8);
  }
  else {
    iVar5 = p->vDivs->nSize;
    uVar7 = uVar1 >> 1;
    if ((int)uVar7 < iVar5) {
      if (uVar16 != 1) {
        __assert_fail("Vec_IntSize(p->vGates) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                      ,0x1dc,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
      }
      pwVar6 = (word *)p->vDivs->pArray[uVar7];
    }
    else {
      if (uVar16 == 1) {
        __assert_fail("Vec_IntSize(p->vGates) > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                      ,0x1e2,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
      }
      if ((uVar16 & 1) == 0) {
        __assert_fail("Vec_IntSize(p->vGates) % 2 == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                      ,0x1e3,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
      }
      if (uVar7 - iVar5 != (uVar16 >> 1) - 1) {
        __assert_fail("Abc_Lit2Var(iTopLit)-nVars == Vec_IntSize(p->vGates)/2-1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                      ,0x1e4,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
      }
      pVVar10 = p->vSims;
      iVar15 = uVar16 * p->nWords;
      uVar16 = iVar15 / 2;
      if (pVVar10->nCap < (int)uVar16) {
        if (pVVar10->pArray == (word *)0x0) {
          pwVar6 = (word *)malloc((long)(int)uVar16 << 3);
        }
        else {
          pwVar6 = (word *)realloc(pVVar10->pArray,(long)(int)uVar16 << 3);
        }
        pVVar10->pArray = pwVar6;
        if (pwVar6 == (word *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
        }
        pVVar10->nCap = uVar16;
      }
      if (1 < iVar15) {
        memset(pVVar10->pArray,0,(ulong)uVar16 << 3);
      }
      pVVar10->nSize = uVar16;
      iVar15 = p->vGates->nSize;
      if (iVar15 < 2) {
        pVVar10 = p->vSims;
        uVar16 = p->nWords;
      }
      else {
        piVar3 = p->vGates->pArray;
        lVar9 = 0;
        do {
          uVar7 = piVar3[lVar9];
          if (((int)uVar7 < 0) || (uVar2 = piVar3[lVar9 + 1], (int)uVar2 < 0)) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar17 = uVar7 >> 1;
          if ((int)uVar17 < iVar5) {
            if (p->vDivs->nSize <= (int)uVar17) goto LAB_0079b640;
            pwVar6 = (word *)p->vDivs->pArray[uVar17];
          }
          else {
            uVar16 = (uVar17 - iVar5) * p->nWords;
            if (((int)uVar16 < 0) || (p->vSims->nSize <= (int)uVar16)) goto LAB_0079b602;
            pwVar6 = p->vSims->pArray + uVar16;
          }
          uVar14 = uVar2 >> 1;
          if ((int)uVar14 < iVar5) {
            if (p->vDivs->nSize <= (int)uVar14) {
LAB_0079b640:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pwVar12 = (word *)p->vDivs->pArray[uVar14];
            pVVar10 = p->vSims;
            uVar16 = p->nWords;
          }
          else {
            uVar16 = p->nWords;
            uVar13 = (uVar14 - iVar5) * uVar16;
            if (((int)uVar13 < 0) || (pVVar10 = p->vSims, pVVar10->nSize <= (int)uVar13))
            goto LAB_0079b602;
            pwVar12 = pVVar10->pArray + uVar13;
          }
          uVar13 = (int)((int)lVar9 * uVar16) >> 1;
          if (((int)uVar13 < 0) || (pVVar10->nSize <= (int)uVar13)) goto LAB_0079b602;
          pwVar4 = pVVar10->pArray;
          if (uVar17 < uVar14) {
            if ((uVar7 & 1) == 0) {
              if ((uVar2 & 1) == 0) {
                if (0 < (int)uVar16) {
                  uVar8 = 0;
                  do {
                    pwVar4[uVar13 + uVar8] = pwVar12[uVar8] & pwVar6[uVar8];
                    uVar8 = uVar8 + 1;
                  } while (uVar16 != uVar8);
                }
              }
              else if (0 < (int)uVar16) {
                uVar8 = 0;
                do {
                  pwVar4[uVar13 + uVar8] = ~pwVar12[uVar8] & pwVar6[uVar8];
                  uVar8 = uVar8 + 1;
                } while (uVar16 != uVar8);
              }
            }
            else if ((uVar2 & 1) == 0) {
              if (0 < (int)uVar16) {
                uVar8 = 0;
                do {
                  pwVar4[uVar13 + uVar8] = ~pwVar6[uVar8] & pwVar12[uVar8];
                  uVar8 = uVar8 + 1;
                } while (uVar16 != uVar8);
              }
            }
            else if (0 < (int)uVar16) {
              uVar8 = 0;
              do {
                pwVar4[uVar13 + uVar8] = ~(pwVar12[uVar8] | pwVar6[uVar8]);
                uVar8 = uVar8 + 1;
              } while (uVar16 != uVar8);
            }
          }
          else {
            if (uVar17 <= uVar14) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                            ,0x1f5,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
            }
            if ((uVar7 & 1) != 0) {
              __assert_fail("!Abc_LitIsCompl(iLit0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                            ,0x1f1,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
            }
            if ((uVar2 & 1) != 0) {
              __assert_fail("!Abc_LitIsCompl(iLit1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                            ,0x1f2,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
            }
            if (0 < (int)uVar16) {
              uVar8 = 0;
              do {
                pwVar4[uVar13 + uVar8] = pwVar12[uVar8] ^ pwVar6[uVar8];
                uVar8 = uVar8 + 1;
              } while (uVar16 != uVar8);
            }
          }
          lVar9 = lVar9 + 2;
        } while ((int)((uint)lVar9 | 1) < iVar15);
      }
      uVar16 = (iVar15 / 2 + -1) * uVar16;
      if (((int)uVar16 < 0) || (pVVar10->nSize <= (int)uVar16)) {
LAB_0079b602:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      pwVar6 = pVVar10->pArray + uVar16;
    }
    uVar16 = p->nWords;
    uVar8 = (ulong)uVar16;
    if ((uVar1 & 1) == 0) {
      if (0 < (int)uVar16) {
        iVar5 = 0;
        uVar11 = 0;
        do {
          if ((pwVar6[uVar11] & p->pSets[0][uVar11]) != 0) goto LAB_0079b5b0;
          uVar11 = uVar11 + 1;
        } while (uVar8 != uVar11);
        iVar5 = 0;
        uVar11 = 0;
        do {
          if ((p->pSets[1][uVar11] & ~pwVar6[uVar11]) != 0) goto LAB_0079b5b0;
          uVar11 = uVar11 + 1;
        } while (uVar8 != uVar11);
LAB_0079b5ab:
        iVar5 = 1;
LAB_0079b5b0:
        if (pFunc == (word *)0x0) {
          return iVar5;
        }
        if ((uVar1 & 1) != 0) {
          if (0 < (int)uVar16) {
            uVar11 = 0;
            do {
              pFunc[uVar11] = ~pwVar6[uVar11];
              uVar11 = uVar11 + 1;
            } while (uVar8 != uVar11);
            return iVar5;
          }
          return iVar5;
        }
        if (0 < (int)uVar16) {
          uVar11 = 0;
          do {
            pFunc[uVar11] = pwVar6[uVar11];
            uVar11 = uVar11 + 1;
          } while (uVar8 != uVar11);
          return iVar5;
        }
        return iVar5;
      }
    }
    else if (0 < (int)uVar16) {
      iVar5 = 0;
      uVar11 = 0;
      do {
        if ((pwVar6[uVar11] & p->pSets[1][uVar11]) != 0) goto LAB_0079b5b0;
        uVar11 = uVar11 + 1;
      } while (uVar8 != uVar11);
      iVar5 = 0;
      uVar11 = 0;
      do {
        if ((p->pSets[0][uVar11] & ~pwVar6[uVar11]) != 0) goto LAB_0079b5b0;
        uVar11 = uVar11 + 1;
      } while (uVar8 != uVar11);
      goto LAB_0079b5ab;
    }
  }
  return 1;
}

Assistant:

int Gia_ManResubVerify( Gia_ResbMan_t * p, word * pFunc )
{
    int nVars = Vec_PtrSize(p->vDivs);
    int iTopLit, RetValue;
    word * pDivRes; 
    if ( Vec_IntSize(p->vGates) == 0 )
        return -1;
    iTopLit = Vec_IntEntryLast(p->vGates);
    assert( iTopLit >= 0 );
    if ( iTopLit == 0 )
    {
        if ( pFunc ) Abc_TtClear( pFunc, p->nWords );
        return Abc_TtIsConst0( p->pSets[1], p->nWords );
    }
    if ( iTopLit == 1 )
    {
        if ( pFunc ) Abc_TtFill( pFunc, p->nWords );
        return Abc_TtIsConst0( p->pSets[0], p->nWords );
    }
    if ( Abc_Lit2Var(iTopLit) < nVars )
    {
        assert( Vec_IntSize(p->vGates) == 1 );
        pDivRes = (word *)Vec_PtrEntry( p->vDivs, Abc_Lit2Var(iTopLit) );
    }
    else
    {
        int i, iLit0, iLit1;
        assert( Vec_IntSize(p->vGates) > 1 );
        assert( Vec_IntSize(p->vGates) % 2 == 1 );
        assert( Abc_Lit2Var(iTopLit)-nVars == Vec_IntSize(p->vGates)/2-1 );
        Vec_WrdFill( p->vSims, p->nWords * Vec_IntSize(p->vGates)/2, 0 );
        Vec_IntForEachEntryDouble( p->vGates, iLit0, iLit1, i )
        {
            int iVar0 = Abc_Lit2Var(iLit0);
            int iVar1 = Abc_Lit2Var(iLit1);
            word * pDiv0 = iVar0 < nVars ? (word *)Vec_PtrEntry(p->vDivs, iVar0) : Vec_WrdEntryP(p->vSims, p->nWords*(iVar0 - nVars));
            word * pDiv1 = iVar1 < nVars ? (word *)Vec_PtrEntry(p->vDivs, iVar1) : Vec_WrdEntryP(p->vSims, p->nWords*(iVar1 - nVars));
            word * pDiv  = Vec_WrdEntryP(p->vSims, p->nWords*i/2);
            if ( iVar0 < iVar1 )
                Abc_TtAndCompl( pDiv, pDiv0, Abc_LitIsCompl(iLit0), pDiv1, Abc_LitIsCompl(iLit1), p->nWords );
            else if ( iVar0 > iVar1 )
            {
                assert( !Abc_LitIsCompl(iLit0) );
                assert( !Abc_LitIsCompl(iLit1) );
                Abc_TtXor( pDiv, pDiv0, pDiv1, p->nWords, 0 );
            }
            else assert( 0 );
        }
        pDivRes = Vec_WrdEntryP( p->vSims, p->nWords*(Vec_IntSize(p->vGates)/2-1) );
    }
    if ( Abc_LitIsCompl(iTopLit) )
        RetValue = !Abc_TtIntersectOne(p->pSets[1], 0, pDivRes, 0, p->nWords) && !Abc_TtIntersectOne(p->pSets[0], 0, pDivRes, 1, p->nWords);
    else
        RetValue = !Abc_TtIntersectOne(p->pSets[0], 0, pDivRes, 0, p->nWords) && !Abc_TtIntersectOne(p->pSets[1], 0, pDivRes, 1, p->nWords);
    if ( pFunc ) Abc_TtCopy( pFunc, pDivRes, p->nWords, Abc_LitIsCompl(iTopLit) );
    return RetValue;
}